

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::standard_library::
          random_access_container_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (string *param_1,ModulePtr *m)

{
  element_type *name;
  Module *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ModulePtr MVar1;
  anon_class_1_0_00000001_for_m_f *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  Proxy_Function *in_stack_ffffffffffffff28;
  allocator *f;
  allocator local_a1;
  string local_a0 [79];
  allocator local_51;
  string local_50 [80];
  
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4561be);
  fun<chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,int)_1_>
            ((anon_class_1_0_00000001_for_m_f *)in_stack_ffffffffffffff18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"[]",&local_51);
  Module::add(in_RDX,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x456248);
  name = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x456252);
  fun<chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)_1_>
            (in_stack_ffffffffffffff18);
  f = &local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"[]",f);
  Module::add(in_RDX,(Proxy_Function *)f,(string *)name);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x4562c1);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)name,
             (shared_ptr<chaiscript::Module> *)in_stack_ffffffffffffff18);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr random_access_container_type(const std::string &/*type*/, ModulePtr m = std::make_shared<Module>())
        {
          //In the interest of runtime safety for the m, we prefer the at() method for [] access,
          //to throw an exception in an out of bounds condition.
          m->add(
              fun(
                [](ContainerType &c, int index) -> typename ContainerType::reference {
                  return c.at(index);
                }), "[]");

          m->add(
              fun(
                [](const ContainerType &c, int index) -> typename ContainerType::const_reference {
                  return c.at(index);
                }), "[]");

          return m;
        }